

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O0

void flatbuffers::cpp::CppGenerator::PaddingInitializer(int bits,string *code_ptr,int *id)

{
  int t;
  ulong uVar1;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int *local_20;
  int *id_local;
  string *code_ptr_local;
  int bits_local;
  
  local_20 = id;
  id_local = (int *)code_ptr;
  code_ptr_local._4_4_ = bits;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)id_local,",\n        ");
  }
  t = *local_20;
  *local_20 = t + 1;
  NumToString<int>(&local_80,t);
  std::operator+(&local_60,"padding",&local_80);
  std::operator+(&local_40,&local_60,"__(0)");
  std::__cxx11::string::operator+=((string *)id_local,(string *)&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  return;
}

Assistant:

static void PaddingInitializer(int bits, std::string *code_ptr, int *id) {
    (void)bits;
    if (!code_ptr->empty()) *code_ptr += ",\n        ";
    *code_ptr += "padding" + NumToString((*id)++) + "__(0)";
  }